

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::TrigramAlphabet::MegaMatch(TrigramAlphabet *this,char16 *input,int inputLen)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined1 *puVar4;
  char16 *pcVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  bool bVar15;
  
  this->input = input;
  this->inputLen = inputLen;
  if (7 < inputLen) {
    pcVar5 = input + 2;
    lVar7 = 0x300000000;
    bVar8 = this->alphaBits[(ushort)*input & 0x5f];
    bVar14 = this->alphaBits[(ushort)input[1] & 0x5f];
    for (uVar10 = 3; uVar10 != inputLen - 5; uVar10 = uVar10 + 1) {
      bVar1 = this->alphaBits[(ushort)*pcVar5 & 0x5f];
      lVar6 = (ulong)((uint)bVar8 * 0x40 + (uint)bVar14 * 8) + (ulong)bVar1;
      if (((uint)lVar6 < 0xdd) && (lVar6 = (long)this->trigramMap[lVar6], lVar6 != 0x41)) {
        lVar12 = (long)this->trigramStarts[lVar6].count;
        if (0 < lVar12) {
          uVar9 = 0;
          lVar13 = 5;
          lVar11 = lVar7;
          while (bVar15 = lVar13 != 0, lVar13 = lVar13 + -1, bVar15) {
            uVar2 = *(ushort *)((long)input + (lVar11 >> 0x1f));
            if ((0x7f < uVar2) || (this->alphaBits[uVar2 & 0x5f] == 4)) goto LAB_00cdf85d;
            uVar9 = uVar9 * 0x10 + (1 << (this->alphaBits[uVar2 & 0x5f] & 0x1fU));
            lVar11 = lVar11 + 0x100000000;
          }
          for (lVar11 = 0; lVar12 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
            if ((uVar9 & ~*(uint *)((long)&this->trigramStarts[lVar6].patterns[0].encodedPattern +
                                   lVar11)) == 0) {
              puVar4 = *(undefined1 **)
                        (*(long *)((long)&this->trigramStarts[lVar6].patterns[0].pattern + lVar11) +
                        0x30);
              iVar3 = *(int *)(puVar4 + 0xc);
              if ((long)iVar3 < 0x20) {
                *(int *)(puVar4 + 0xc) = iVar3 + 1;
                *(int *)(puVar4 + (long)iVar3 * 4 + 0x10) = (int)uVar10 + -3;
              }
              else {
                *puVar4 = 0;
              }
            }
          }
        }
      }
LAB_00cdf85d:
      pcVar5 = input + uVar10;
      lVar7 = lVar7 + 0x100000000;
      bVar8 = bVar14;
      bVar14 = bVar1;
    }
  }
  return;
}

Assistant:

void TrigramAlphabet::MegaMatch(__in_ecount(inputLen) const char16* input,int inputLen) {
        this->input=input;
        this->inputLen=inputLen;
        if (inputLen<TrigramInfo::PatternLength) {
            return;
        }
        // prime the pump
        unsigned char c1=alphaBits[input[0]&UpperCaseMask];
        unsigned char c2=alphaBits[input[1]&UpperCaseMask];
        unsigned char c3=alphaBits[input[2]&UpperCaseMask];
        // pump
        for (int k=3;k<inputLen-5;k++) {
            int index=(c1<<6)+(c2<<3)+c3;
            if (index<TrigramMapSize) {
                int t=trigramMap[index];
                if (t!=TrigramNotInPattern) {
                    int count=trigramStarts[t].count;
                    if (count>0) {
                        int inputMask=0;
                        bool validInput=true;
                        for (int j=0;j<5;j++) {
                            // ascii check
                            if (input[k+j]<128) {
                                int bits=alphaBits[input[k+j]&UpperCaseMask];
                                if (bits==BitsNotInAlpha) {
                                    validInput=false;
                                    break;
                                }
                                inputMask=(inputMask<<AlphaCount)+(1<<bits);
                            }
                            else {
                                validInput=false;
                                break;
                            }
                        }
                        if (validInput) {
                            for (int j=0;j<count;j++) {
                                PatternTri* tri= &(trigramStarts[t].patterns[j]);
                                if ((inputMask&(tri->encodedPattern))==inputMask) {
                                    if (tri->pattern->rep.unified.trigramInfo->resultCount<TrigramInfo::MaxResults) {
                                        tri->pattern->rep.unified.trigramInfo->offsets[tri->pattern->rep.unified.trigramInfo->resultCount++]=k-3;
                                    }
                                    else {
                                        tri->pattern->rep.unified.trigramInfo->isTrigramPattern=false;
                                    }
                                }
                            }
                        }
                    }
                }
            }
            c1=c2;
            c2=c3;
            c3=alphaBits[input[k]&UpperCaseMask];
        }
    }